

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void PushStyleCompact(void)

{
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiStyle *local_10;
  ImGuiStyle *style;
  
  local_10 = ImGui::GetStyle();
  ImVec2::ImVec2(&local_18,(local_10->FramePadding).x,(float)(int)((local_10->FramePadding).y * 0.6)
                );
  ImGui::PushStyleVar(0xb,&local_18);
  ImVec2::ImVec2(&local_20,(local_10->ItemSpacing).x,(float)(int)((local_10->ItemSpacing).y * 0.6));
  ImGui::PushStyleVar(0xe,&local_20);
  return;
}

Assistant:

static void PushStyleCompact()
{
    ImGuiStyle& style = ImGui::GetStyle();
    ImGui::PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(style.FramePadding.x, (float)(int)(style.FramePadding.y * 0.60f)));
    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x, (float)(int)(style.ItemSpacing.y * 0.60f)));
}